

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

Polygons * SquareHole(Polygons *__return_storage_ptr__,double xOffset)

{
  initializer_list<linalg::vec<double,_2>_> __l;
  initializer_list<linalg::vec<double,_2>_> __l_00;
  allocator_type local_71;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_70;
  double local_58;
  vec<double,_2> local_50;
  double local_40;
  undefined8 local_38;
  double local_30;
  undefined1 *local_28;
  double local_20;
  undefined1 *local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.x = xOffset + 2.0;
  local_50.y = 2.0;
  local_40 = xOffset + -2.0;
  local_38 = 0x4000000000000000;
  local_28 = (undefined1 *)0xc000000000000000;
  local_18 = (undefined1 *)0xc000000000000000;
  __l._M_len = 4;
  __l._M_array = &local_50;
  local_58 = xOffset;
  local_30 = local_40;
  local_20 = local_50.x;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_70,__l,&local_71);
  std::
  vector<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>,std::allocator<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
  ::emplace_back<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>
            ((vector<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>,std::allocator<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
              *)__return_storage_ptr__,&local_70);
  if (local_70.super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_50.x = local_58 + -1.0;
  local_40 = local_58 + 1.0;
  local_50.y = 1.0;
  local_38 = 0x3ff0000000000000;
  local_28 = &DAT_bff0000000000000;
  local_18 = &DAT_bff0000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = &local_50;
  local_30 = local_40;
  local_20 = local_50.x;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_70,__l_00,&local_71);
  std::
  vector<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>,std::allocator<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
  ::emplace_back<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>
            ((vector<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>,std::allocator<std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
              *)__return_storage_ptr__,&local_70);
  if (local_70.super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Polygons SquareHole(double xOffset) {
  Polygons polys;
  polys.push_back({
      {2 + xOffset, 2},    //
      {-2 + xOffset, 2},   //
      {-2 + xOffset, -2},  //
      {2 + xOffset, -2},   //
  });
  polys.push_back({
      {-1 + xOffset, 1},   //
      {1 + xOffset, 1},    //
      {1 + xOffset, -1},   //
      {-1 + xOffset, -1},  //
  });
  return polys;
}